

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O1

void __thiscall
duckdb::DbpEncoder::WriteValueInternal(DbpEncoder *this,WriteStream *writer,int64_t *value)

{
  data_t *__s;
  byte bVar1;
  idx_t iVar2;
  bool bVar3;
  int64_t *piVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  bitpacking_width_t *pbVar8;
  int64_t iVar9;
  bitpacking_width_t bVar10;
  ulong uVar11;
  ulong uVar12;
  byte bStack_61;
  DbpEncoder *pDStack_60;
  bitpacking_width_t *pbStack_58;
  WriteStream *pWStack_50;
  ulong uStack_48;
  ulong uStack_40;
  int64_t *piStack_38;
  
  lVar6 = *value - this->previous_value;
  this->previous_value = *value;
  lVar5 = this->min_delta;
  if (lVar6 <= this->min_delta) {
    lVar5 = lVar6;
  }
  this->min_delta = lVar5;
  iVar2 = this->block_count;
  this->block_count = iVar2 + 1;
  this->data[iVar2] = lVar6;
  if (this->block_count == 0x800) {
    uVar11 = this->block_count + 0xff;
    uStack_48 = uVar11 >> 8;
    if (0xff < uVar11) {
      piVar4 = this->data;
      lVar5 = 0;
      uVar7 = 0;
      do {
        lVar6 = 0;
        do {
          if ((ulong)(lVar5 + lVar6) < this->block_count) {
            iVar9 = piVar4[lVar6] - this->min_delta;
          }
          else {
            iVar9 = 0;
          }
          piVar4[lVar6] = iVar9;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x100);
        uVar7 = uVar7 + 1;
        piVar4 = piVar4 + 0x100;
        lVar5 = lVar5 + 0x100;
      } while (uVar7 != uStack_48);
    }
    piVar4 = this->data + 1;
    uVar7 = 0;
    do {
      if (uVar7 < uStack_48) {
        uVar12 = this->data[uVar7 * 0x100];
        lVar5 = 0;
        do {
          if (uVar12 < (ulong)piVar4[lVar5]) {
            uVar12 = piVar4[lVar5];
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0xff);
        lVar5 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        bVar10 = '@' - ((byte)lVar5 ^ 0x3f);
        if (uVar12 >> 0x38 != 0) {
          bVar10 = '@';
        }
        if (uVar12 == 0) {
          bVar10 = '\0';
        }
      }
      else {
        bVar10 = '\0';
      }
      this->list_of_bitwidths_of_miniblocks[uVar7] = bVar10;
      uVar7 = uVar7 + 1;
      piVar4 = piVar4 + 0x100;
    } while (uVar7 != 8);
    uVar7 = this->min_delta >> 0x3f ^ this->min_delta * 2;
    do {
      bStack_61 = (0x7f < uVar7) << 7 | (byte)uVar7 & 0x7f;
      (**writer->_vptr_WriteStream)(writer,&bStack_61,1);
      bVar3 = 0x7f < uVar7;
      uVar7 = uVar7 >> 7;
    } while (bVar3);
    pbVar8 = this->list_of_bitwidths_of_miniblocks;
    pDStack_60 = this;
    (**writer->_vptr_WriteStream)(writer,pbVar8,8);
    if (0xff < uVar11) {
      piVar4 = pDStack_60->data;
      __s = pDStack_60->data_packed;
      uVar11 = 0;
      pbStack_58 = pbVar8;
      pWStack_50 = writer;
      do {
        switchD_005700f1::default(__s,0,0x800);
        bVar1 = pbVar8[uVar11];
        uVar12 = 0xffffffffffffffe0;
        uVar7 = 0;
        uStack_40 = uVar11;
        piStack_38 = piVar4;
        do {
          duckdb_fastpforlib::fastpack
                    ((uint64_t *)piVar4,(uint32_t *)(__s + (uVar7 >> 3)),(uint)bVar1);
          uVar11 = uStack_40;
          pbVar8 = pbStack_58;
          uVar12 = uVar12 + 0x20;
          piVar4 = piVar4 + 0x20;
          uVar7 = uVar7 + (ulong)bVar1 * 0x20;
        } while (uVar12 < 0xe0);
        (**pWStack_50->_vptr_WriteStream)(pWStack_50,__s,(ulong)pbStack_58[uStack_40] << 5);
        uVar11 = uVar11 + 1;
        piVar4 = piStack_38 + 0x100;
      } while (uVar11 != uStack_48);
    }
    pDStack_60->count = pDStack_60->count + pDStack_60->block_count;
    pDStack_60->min_delta = 0x7fffffffffffffff;
    pDStack_60->block_count = 0;
    return;
  }
  return;
}

Assistant:

void WriteValueInternal(WriteStream &writer, const int64_t &value) {
		// 1. Compute the differences between consecutive elements. For the first element in the block,
		// use the last element in the previous block or, in the case of the first block,
		// use the first value of the whole sequence, stored in the header.

		// Subtractions in steps 1) and 2) may incur signed arithmetic overflow,
		// and so will the corresponding additions when decoding.
		// Overflow should be allowed and handled as wrapping around in 2’s complement notation
		// so that the original values are correctly restituted.
		// This may require explicit care in some programming languages
		// (for example by doing all arithmetic in the unsigned domain).
		const auto delta = static_cast<int64_t>(static_cast<uint64_t>(value) - static_cast<uint64_t>(previous_value));
		previous_value = value;
		// Compute the frame of reference (the minimum of the deltas in the block).
		min_delta = MinValue(min_delta, delta);
		// append. if block is full, write it out
		data[block_count++] = delta;
		if (block_count == BLOCK_SIZE_IN_VALUES) {
			WriteBlock(writer);
		}
	}